

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_resize_locations(Parser *this,size_t numnewlines)

{
  undefined8 uVar1;
  ulong in_RSI;
  long in_RDI;
  
  if (*(ulong *)(in_RDI + 0xa98) < in_RSI) {
    if (*(long *)(in_RDI + 0xa88) != 0) {
      (**(code **)(in_RDI + 0x9e0))
                (*(undefined8 *)(in_RDI + 0xa88),*(long *)(in_RDI + 0xa98) << 3,
                 *(undefined8 *)(in_RDI + 0x9d0));
      *(undefined8 *)(in_RDI + 0xa88) = 0;
    }
    uVar1 = (**(code **)(in_RDI + 0x9d8))
                      (in_RSI << 3,*(undefined8 *)(in_RDI + 0xa88),*(undefined8 *)(in_RDI + 0x9d0));
    *(undefined8 *)(in_RDI + 0xa88) = uVar1;
    *(ulong *)(in_RDI + 0xa98) = in_RSI;
  }
  return;
}

Assistant:

void Parser::_resize_locations(size_t numnewlines)
{
    if(numnewlines > m_newline_offsets_capacity)
    {
        if(m_newline_offsets)
            _RYML_CB_FREE(m_stack.m_callbacks, m_newline_offsets, size_t, m_newline_offsets_capacity);
        m_newline_offsets = _RYML_CB_ALLOC_HINT(m_stack.m_callbacks, size_t, numnewlines, m_newline_offsets);
        m_newline_offsets_capacity = numnewlines;
    }
}